

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::CheckerMemberVisitor::handle
          (CheckerMemberVisitor *this,HierarchicalValueExpression *expr)

{
  bool bVar1;
  Symbol *this_00;
  StatementBlockSymbol *pSVar2;
  HierarchicalValueExpression *in_RSI;
  Diagnostic *in_RDI;
  Diagnostic *diag;
  Symbol *sym;
  Scope *scope;
  bool inForkJoin;
  Scope *in_stack_000000d8;
  undefined1 in_stack_000000e0 [16];
  DiagCode in_stack_000000f4;
  Symbol *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  Scope *local_20;
  
  bVar1 = false;
  local_20 = Symbol::getParentScope(&((in_RSI->super_ValueExpressionBase).symbol)->super_Symbol);
  while( true ) {
    if ((local_20 == (Scope *)0x0) ||
       (this_00 = Scope::asSymbol(local_20), this_00->kind != StatementBlock)) goto LAB_008f239b;
    pSVar2 = Symbol::as<slang::ast::StatementBlockSymbol>((Symbol *)0x8f237d);
    if (pSVar2->blockKind != Sequential) break;
    local_20 = Symbol::getParentScope(this_00);
  }
  bVar1 = true;
LAB_008f239b:
  if ((!bVar1) ||
     (bVar1 = isFromChecker((CheckerMemberVisitor *)
                            CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                            in_stack_ffffffffffffffc0), bVar1)) {
    ASTVisitor<slang::ast::CheckerMemberVisitor,_true,_true,_false,_false>::
    visitDefault<slang::ast::HierarchicalValueExpression>
              ((ASTVisitor<slang::ast::CheckerMemberVisitor,_true,_true,_false,_false> *)in_RDI,
               in_RSI);
  }
  else {
    Scope::addDiag(in_stack_000000d8,in_stack_000000f4,(SourceRange)in_stack_000000e0);
    Diagnostic::addNote(in_RDI,(DiagCode)0x50001,
                        (((in_RSI->super_ValueExpressionBase).symbol)->super_Symbol).location);
  }
  return;
}

Assistant:

void handle(const HierarchicalValueExpression& expr) {
        bool inForkJoin = false;
        auto scope = expr.symbol.getParentScope();
        while (scope) {
            auto& sym = scope->asSymbol();
            if (sym.kind != SymbolKind::StatementBlock)
                break;

            if (sym.as<StatementBlockSymbol>().blockKind != StatementBlockKind::Sequential) {
                inForkJoin = true;
                break;
            }

            scope = sym.getParentScope();
        }

        if (inForkJoin && !isFromChecker(expr.symbol)) {
            auto& diag = body.addDiag(diag::CheckerForkJoinRef, expr.sourceRange);
            diag.addNote(diag::NoteDeclarationHere, expr.symbol.location);
            return;
        }

        visitDefault(expr);
    }